

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hxx
# Opt level: O3

size_t __thiscall
andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertEdge
          (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *this,size_t vertexIndex0,
          size_t vertexIndex1)

{
  pointer pRVar1;
  pointer pAVar2;
  iterator __position;
  ulong uVar3;
  ulong uVar4;
  pointer pAVar5;
  difference_type __d;
  ulong uVar6;
  pointer pEVar7;
  size_t sVar8;
  Edge<false,_unsigned_long> local_20;
  
  if (this->multipleEdgesEnabled_ != true) {
    pRVar1 = (this->vertices_).
             super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar8 = vertexIndex0;
    uVar3 = vertexIndex1;
    if ((ulong)((long)*(pointer *)
                       ((long)&pRVar1[vertexIndex1].vector_.
                               super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                       + 8) -
               *(long *)&pRVar1[vertexIndex1].vector_.
                         super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
               ) <
        (ulong)((long)*(pointer *)
                       ((long)&pRVar1[vertexIndex0].vector_.
                               super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                       + 8) -
               *(long *)&pRVar1[vertexIndex0].vector_.
                         super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
               )) {
      sVar8 = vertexIndex1;
      uVar3 = vertexIndex0;
    }
    pAVar5 = *(pointer *)
              &pRVar1[sVar8].vector_.
               super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
    ;
    pAVar2 = *(pointer *)
              ((long)&pRVar1[sVar8].vector_.
                      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
              + 8);
    uVar6 = (long)pAVar2 - (long)pAVar5 >> 4;
    while (uVar4 = uVar6, 0 < (long)uVar4) {
      uVar6 = uVar4 >> 1;
      if (pAVar5[uVar6].vertex_ < uVar3) {
        pAVar5 = pAVar5 + uVar6 + 1;
        uVar6 = ~uVar6 + uVar4;
      }
    }
    if ((pAVar2 != pAVar5) && (pAVar5->vertex_ == uVar3)) {
      return pAVar5->edge_;
    }
  }
  local_20.vertexIndices_[0] = vertexIndex1;
  if (vertexIndex0 < vertexIndex1) {
    local_20.vertexIndices_[0] = vertexIndex0;
  }
  if (vertexIndex1 < vertexIndex0) {
    vertexIndex1 = vertexIndex0;
  }
  __position._M_current =
       (this->edges_).
       super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_20.vertexIndices_[1] = vertexIndex1;
  if (__position._M_current ==
      (this->edges_).
      super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<andres::graph::detail::Edge<false,unsigned_long>,std::allocator<andres::graph::detail::Edge<false,unsigned_long>>>
    ::_M_realloc_insert<andres::graph::detail::Edge<false,unsigned_long>>
              ((vector<andres::graph::detail::Edge<false,unsigned_long>,std::allocator<andres::graph::detail::Edge<false,unsigned_long>>>
                *)&this->edges_,__position,&local_20);
    pEVar7 = (this->edges_).
             super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (__position._M_current)->vertexIndices_[0] = local_20.vertexIndices_[0];
    (__position._M_current)->vertexIndices_[1] = vertexIndex1;
    pEVar7 = (this->edges_).
             super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->edges_).
    super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar7;
  }
  sVar8 = ((long)pEVar7 -
           (long)(this->edges_).
                 super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
  insertAdjacenciesForEdge(this,sVar8);
  return sVar8;
}

Assistant:

inline std::size_t
Graph<VISITOR>::insertEdge(
    const std::size_t vertexIndex0,
    const std::size_t vertexIndex1
) {
    assert(vertexIndex0 < numberOfVertices()); 
    assert(vertexIndex1 < numberOfVertices()); 
    
    if(multipleEdgesEnabled()) {
insertEdgeMark:
        edges_.push_back(Edge(vertexIndex0, vertexIndex1));
        std::size_t edgeIndex = edges_.size() - 1;
        insertAdjacenciesForEdge(edgeIndex);
        visitor_.insertEdge(edgeIndex);  
        return edgeIndex;
    }
    else {
        std::pair<bool, std::size_t> p = findEdge(vertexIndex0, vertexIndex1);
        if(p.first) { // edge already exists
            return p.second;
        }
        else {
            goto insertEdgeMark;
        }
    }
}